

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.cpp
# Opt level: O0

uint sparse_count_chunks(sparse_file *s)

{
  uint uVar1;
  uint *in_RDI;
  uint chunks;
  uint last_block;
  backed_block *bb;
  uint local_18;
  uint local_14;
  backed_block *local_10;
  
  local_14 = 0;
  local_18 = 0;
  for (local_10 = backed_block_iter_new(*(backed_block_list **)(in_RDI + 6));
      local_10 != (backed_block *)0x0; local_10 = backed_block_iter_next(local_10)) {
    uVar1 = backed_block_block(local_10);
    if (local_14 < uVar1) {
      local_18 = local_18 + 1;
    }
    local_18 = local_18 + 1;
    local_14 = backed_block_block(local_10);
    uVar1 = backed_block_len(local_10);
    local_14 = local_14 + ((uVar1 + *in_RDI) - 1) / *in_RDI;
  }
  if ((long)(ulong)local_14 <
      (long)(*(long *)(in_RDI + 2) + (ulong)*in_RDI + -1) / (long)(ulong)*in_RDI) {
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

unsigned int sparse_count_chunks(struct sparse_file* s) {
  struct backed_block* bb;
  unsigned int last_block = 0;
  unsigned int chunks = 0;

  for (bb = backed_block_iter_new(s->backed_block_list); bb; bb = backed_block_iter_next(bb)) {
    if (backed_block_block(bb) > last_block) {
      /* If there is a gap between chunks, add a skip chunk */
      chunks++;
    }
    chunks++;
    last_block = backed_block_block(bb) + DIV_ROUND_UP(backed_block_len(bb), s->block_size);
  }
  if (last_block < DIV_ROUND_UP(s->len, s->block_size)) {
    chunks++;
  }

  return chunks;
}